

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O2

bool __thiscall
duckdb::LogicalDependencyEquality::operator()
          (LogicalDependencyEquality *this,LogicalDependency *a,LogicalDependency *b)

{
  bool bVar1;
  
  if ((a->entry).type != (b->entry).type) {
    return false;
  }
  bVar1 = ::std::operator!=(&(a->entry).name,&(b->entry).name);
  if ((!bVar1) && (bVar1 = ::std::operator!=(&(a->entry).schema,&(b->entry).schema), !bVar1)) {
    bVar1 = ::std::operator!=(&a->catalog,&b->catalog);
    return !bVar1;
  }
  return false;
}

Assistant:

bool LogicalDependencyEquality::operator()(const LogicalDependency &a, const LogicalDependency &b) const {
	if (a.entry.type != b.entry.type) {
		return false;
	}
	if (a.entry.name != b.entry.name) {
		return false;
	}
	if (a.entry.schema != b.entry.schema) {
		return false;
	}
	if (a.catalog != b.catalog) {
		return false;
	}
	return true;
}